

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> __thiscall
kern::DispatchBuilder::build(DispatchBuilder *this)

{
  undefined8 *puVar1;
  long *in_RSI;
  unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *d;
  
  if ((Dispatch *)*in_RSI != (Dispatch *)0x0) {
    this->inner = (Dispatch *)*in_RSI;
    *in_RSI = 0;
    return (__uniq_ptr_data<kern::Dispatch,_std::default_delete<kern::Dispatch>,_true,_true>)
           (__uniq_ptr_data<kern::Dispatch,_std::default_delete<kern::Dispatch>,_true,_true>)this;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_00109b68;
  __cxa_throw(puVar1,&BuilderReuseException::typeinfo,std::exception::~exception);
}

Assistant:

std::unique_ptr<Dispatch> DispatchBuilder::build() {
         if(this->inner == nullptr)
            throw BuilderReuseException();

        auto d = std::unique_ptr<Dispatch>(this->inner);

        // Marks the Builder as being exhausted.
        this->inner = nullptr;

        return d;
    }